

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileOptions::MergePartialFromCodedStream
          (FileOptions *this,CodedInputStream *input)

{
  ExtensionSet *this_00;
  UnknownFieldSet *unknown_fields;
  int *piVar1;
  byte *pbVar2;
  uint8 uVar3;
  int iVar4;
  int iVar5;
  uint8 *puVar6;
  void **ppvVar7;
  FileOptions *pFVar8;
  bool bVar9;
  Limit limit;
  string *psVar10;
  uint32 tag;
  uint local_54;
  FileOptions *local_50;
  UninterpretedOption *local_48;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *local_40;
  RepeatedPtrFieldBase *local_38;
  
  this_00 = &this->_extensions_;
  unknown_fields = &this->_unknown_fields_;
  local_40 = &this->uninterpreted_option_;
  local_38 = &local_40->super_RepeatedPtrFieldBase;
LAB_001ef40f:
  puVar6 = input->buffer_;
  if ((puVar6 < input->buffer_end_) && (tag = (uint32)(char)*puVar6, -1 < (char)*puVar6)) {
    input->last_tag_ = tag;
    input->buffer_ = puVar6 + 1;
  }
  else {
    tag = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = tag;
  }
  if (tag == 0) {
    return true;
  }
  switch(tag >> 3) {
  case 1:
    if ((tag & 7) == 2) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      if (this->java_package_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar10 = (string *)operator_new(0x20);
        (psVar10->_M_dataplus)._M_p = (pointer)&psVar10->field_2;
        psVar10->_M_string_length = 0;
        (psVar10->field_2)._M_local_buf[0] = '\0';
        this->java_package_ = psVar10;
      }
      bVar9 = internal::WireFormatLite::ReadString(input,this->java_package_);
      if (!bVar9) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->java_package_->_M_dataplus)._M_p,(int)this->java_package_->_M_string_length,
                 PARSE);
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (*puVar6 == 'B')) {
        input->buffer_ = puVar6 + 1;
LAB_001ef562:
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
        if (this->java_outer_classname_ == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar10 = (string *)operator_new(0x20);
          (psVar10->_M_dataplus)._M_p = (pointer)&psVar10->field_2;
          psVar10->_M_string_length = 0;
          (psVar10->field_2)._M_local_buf[0] = '\0';
          this->java_outer_classname_ = psVar10;
        }
        bVar9 = internal::WireFormatLite::ReadString(input,this->java_outer_classname_);
        if (!bVar9) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->java_outer_classname_->_M_dataplus)._M_p,
                   (int)this->java_outer_classname_->_M_string_length,PARSE);
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (*puVar6 == 'H')) {
          input->buffer_ = puVar6 + 1;
LAB_001ef5db:
          puVar6 = input->buffer_;
          local_50 = this;
          if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (char)uVar3)) {
            input->buffer_ = puVar6 + 1;
            bVar9 = true;
            local_54 = (int)(char)uVar3;
          }
          else {
            bVar9 = io::CodedInputStream::ReadVarint32Fallback(input,&local_54);
          }
          if (bVar9 == false) {
            return false;
          }
          local_40 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)(ulong)local_54;
          if (local_54 - 1 < 3) {
            *(byte *)local_50->_has_bits_ = (byte)local_50->_has_bits_[0] | 0x10;
            local_50->optimize_for_ = local_54;
          }
          else {
            UnknownFieldSet::AddVarint(unknown_fields,9,(long)(int)local_54);
          }
          if (bVar9 == false) {
            return false;
          }
          puVar6 = input->buffer_;
          this = local_50;
          if ((puVar6 < input->buffer_end_) && (*puVar6 == 'P')) {
            input->buffer_ = puVar6 + 1;
LAB_001ef6d9:
            puVar6 = input->buffer_;
            if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (char)uVar3)) {
              input->buffer_ = puVar6 + 1;
              local_54 = (int)(char)uVar3;
            }
            else {
              bVar9 = io::CodedInputStream::ReadVarint32Fallback(input,&local_54);
              if (!bVar9) {
                return false;
              }
            }
            this->java_multiple_files_ = local_54 != 0;
            *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
            puVar6 = input->buffer_;
            if ((puVar6 < input->buffer_end_) && (*puVar6 == 'Z')) {
              input->buffer_ = puVar6 + 1;
LAB_001ef73c:
              *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x20;
              if (this->go_package_ == (string *)internal::kEmptyString_abi_cxx11_) {
                psVar10 = (string *)operator_new(0x20);
                (psVar10->_M_dataplus)._M_p = (pointer)&psVar10->field_2;
                psVar10->_M_string_length = 0;
                (psVar10->field_2)._M_local_buf[0] = '\0';
                this->go_package_ = psVar10;
              }
              bVar9 = internal::WireFormatLite::ReadString(input,this->go_package_);
              if (!bVar9) {
                return false;
              }
              internal::WireFormat::VerifyUTF8StringFallback
                        ((this->go_package_->_M_dataplus)._M_p,
                         (int)this->go_package_->_M_string_length,PARSE);
            }
          }
        }
      }
      goto LAB_001ef40f;
    }
    break;
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x13:
    break;
  case 8:
    if ((tag & 7) == 2) goto LAB_001ef562;
    break;
  case 9:
    if ((tag & 7) == 0) goto LAB_001ef5db;
    break;
  case 10:
    if ((tag & 7) == 0) goto LAB_001ef6d9;
    break;
  case 0xb:
    if ((tag & 7) == 2) goto LAB_001ef73c;
    break;
  case 0x10:
    if ((tag & 7) != 0) break;
    puVar6 = input->buffer_;
    if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (char)uVar3)) {
      input->buffer_ = puVar6 + 1;
      local_54 = (int)(char)uVar3;
    }
    else {
      bVar9 = io::CodedInputStream::ReadVarint32Fallback(input,&local_54);
      if (!bVar9) {
        return false;
      }
    }
    this->cc_generic_services_ = local_54 != 0;
    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x40;
    puVar6 = input->buffer_;
    if (((1 < *(int *)&input->buffer_end_ - (int)puVar6) && (*puVar6 == 0x88)) &&
       (puVar6[1] == '\x01')) {
      input->buffer_ = puVar6 + 2;
LAB_001ef837:
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (char)uVar3)) {
        input->buffer_ = puVar6 + 1;
        local_54 = (int)(char)uVar3;
      }
      else {
        bVar9 = io::CodedInputStream::ReadVarint32Fallback(input,&local_54);
        if (!bVar9) {
          return false;
        }
      }
      this->java_generic_services_ = local_54 != 0;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x80;
      puVar6 = input->buffer_;
      if (((1 < *(int *)&input->buffer_end_ - (int)puVar6) && (*puVar6 == 0x90)) &&
         (puVar6[1] == '\x01')) {
        input->buffer_ = puVar6 + 2;
LAB_001ef8a9:
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (char)uVar3)) {
          input->buffer_ = puVar6 + 1;
          local_54 = (int)(char)uVar3;
        }
        else {
          bVar9 = io::CodedInputStream::ReadVarint32Fallback(input,&local_54);
          if (!bVar9) {
            return false;
          }
        }
        this->py_generic_services_ = local_54 != 0;
        pbVar2 = (byte *)((long)this->_has_bits_ + 1);
        *pbVar2 = *pbVar2 | 1;
        puVar6 = input->buffer_;
        if (((1 < *(int *)&input->buffer_end_ - (int)puVar6) && (*puVar6 == 0xa0)) &&
           (puVar6[1] == '\x01')) {
          input->buffer_ = puVar6 + 2;
LAB_001ef91b:
          puVar6 = input->buffer_;
          if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (char)uVar3)) {
            input->buffer_ = puVar6 + 1;
            local_54 = (int)(char)uVar3;
          }
          else {
            bVar9 = io::CodedInputStream::ReadVarint32Fallback(input,&local_54);
            if (!bVar9) {
              return false;
            }
          }
          this->java_generate_equals_and_hash_ = local_54 != 0;
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
          puVar6 = input->buffer_;
          if (((1 < *(int *)&input->buffer_end_ - (int)puVar6) && (*puVar6 == 0xba)) &&
             (puVar6[1] == '>')) {
            input->buffer_ = puVar6 + 2;
            pFVar8 = this;
LAB_001ef992:
            while( true ) {
              local_50 = pFVar8;
              pFVar8 = local_50;
              iVar4 = (local_50->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
              iVar5 = (local_50->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
              if (iVar4 < iVar5) {
                ppvVar7 = (local_50->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
                (local_50->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ =
                     iVar4 + 1;
                local_48 = (UninterpretedOption *)ppvVar7[iVar4];
              }
              else {
                iVar4 = (local_50->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
                if (iVar5 == iVar4) {
                  internal::RepeatedPtrFieldBase::Reserve(local_38,iVar4 + 1);
                }
                piVar1 = &(pFVar8->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_
                ;
                *piVar1 = *piVar1 + 1;
                local_48 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption>::New
                                     ();
                ppvVar7 = (pFVar8->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
                iVar4 = (pFVar8->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
                (pFVar8->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1
                ;
                ppvVar7[iVar4] = local_48;
              }
              puVar6 = input->buffer_;
              if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (char)uVar3)) {
                input->buffer_ = puVar6 + 1;
                local_54 = (int)(char)uVar3;
              }
              else {
                bVar9 = io::CodedInputStream::ReadVarint32Fallback(input,&local_54);
                if (!bVar9) {
                  return false;
                }
              }
              iVar4 = input->recursion_depth_;
              input->recursion_depth_ = iVar4 + 1;
              if (input->recursion_limit_ <= iVar4) {
                return false;
              }
              limit = io::CodedInputStream::PushLimit(input,local_54);
              bVar9 = UninterpretedOption::MergePartialFromCodedStream(local_48,input);
              if (!bVar9) {
                return false;
              }
              if (input->legitimate_message_end_ != true) {
                return false;
              }
              io::CodedInputStream::PopLimit(input,limit);
              if (0 < input->recursion_depth_) {
                input->recursion_depth_ = input->recursion_depth_ + -1;
              }
              puVar6 = input->buffer_;
              if ((((int)input->buffer_end_ - (int)puVar6 < 2) || (*puVar6 != 0xba)) ||
                 (puVar6[1] != '>')) break;
              input->buffer_ = puVar6 + 2;
              pFVar8 = local_50;
            }
            this = local_50;
            if ((input->buffer_ == input->buffer_end_) &&
               ((input->buffer_size_after_limit_ != 0 ||
                (input->total_bytes_read_ == input->current_limit_)))) {
              input->last_tag_ = 0;
              input->legitimate_message_end_ = true;
              return true;
            }
          }
        }
      }
    }
    goto LAB_001ef40f;
  case 0x11:
    if ((tag & 7) == 0) goto LAB_001ef837;
    break;
  case 0x12:
    if ((tag & 7) == 0) goto LAB_001ef8a9;
    break;
  case 0x14:
    if ((tag & 7) == 0) goto LAB_001ef91b;
    break;
  default:
    if ((tag >> 3 == 999) && (pFVar8 = this, (tag & 7) == 2)) goto LAB_001ef992;
  }
  if ((tag & 7) == 4) {
    return true;
  }
  if (tag < 8000) {
    bVar9 = internal::WireFormat::SkipField(input,tag,unknown_fields);
  }
  else {
    bVar9 = internal::ExtensionSet::ParseField(this_00,tag,input,default_instance_,unknown_fields);
  }
  if (bVar9 == false) {
    return false;
  }
  goto LAB_001ef40f;
}

Assistant:

bool FileOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string java_package = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->java_package().data(), this->java_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(66)) goto parse_java_outer_classname;
        break;
      }

      // optional string java_outer_classname = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_java_outer_classname:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_outer_classname()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->java_outer_classname().data(), this->java_outer_classname().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(72)) goto parse_optimize_for;
        break;
      }

      // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
      case 9: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_optimize_for:
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FileOptions_OptimizeMode_IsValid(value)) {
            set_optimize_for(static_cast< ::google::protobuf::FileOptions_OptimizeMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(9, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_java_multiple_files;
        break;
      }

      // optional bool java_multiple_files = 10 [default = false];
      case 10: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_java_multiple_files:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_multiple_files_)));
          set_has_java_multiple_files();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(90)) goto parse_go_package;
        break;
      }

      // optional string go_package = 11;
      case 11: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_go_package:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_go_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->go_package().data(), this->go_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(128)) goto parse_cc_generic_services;
        break;
      }

      // optional bool cc_generic_services = 16 [default = false];
      case 16: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_cc_generic_services:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cc_generic_services_)));
          set_has_cc_generic_services();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(136)) goto parse_java_generic_services;
        break;
      }

      // optional bool java_generic_services = 17 [default = false];
      case 17: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_java_generic_services:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generic_services_)));
          set_has_java_generic_services();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(144)) goto parse_py_generic_services;
        break;
      }

      // optional bool py_generic_services = 18 [default = false];
      case 18: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_py_generic_services:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &py_generic_services_)));
          set_has_py_generic_services();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(160)) goto parse_java_generate_equals_and_hash;
        break;
      }

      // optional bool java_generate_equals_and_hash = 20 [default = false];
      case 20: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_java_generate_equals_and_hash:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generate_equals_and_hash_)));
          set_has_java_generate_equals_and_hash();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}